

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-keymap.c
# Opt level: O0

void keymap_free(void)

{
  keymap *pkVar1;
  keymap *next;
  keymap *k;
  size_t i;
  
  for (k = (keymap *)0x0; k < (keymap *)0x2; k = (keymap *)((long)&(k->key).type + 1)) {
    next = keymaps[(long)k];
    while (next != (keymap *)0x0) {
      pkVar1 = next->next;
      mem_free(next->actions);
      mem_free(next);
      next = pkVar1;
    }
  }
  return;
}

Assistant:

void keymap_free(void)
{
	size_t i;
	struct keymap *k;
	for (i = 0; i < N_ELEMENTS(keymaps); i++) {
		k = keymaps[i];
		while (k) {
			struct keymap *next = k->next;
			mem_free(k->actions);
			mem_free(k);
			k = next;
		}
	}
}